

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

void putRGBAAseparate8bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *r,uchar *g,uchar *b,uchar *a)

{
  long lVar1;
  long lVar2;
  
  if (h == 0) {
    return;
  }
  if (7 < w) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      *cp = CONCAT13(a[lVar2 * 4],CONCAT12(b[lVar2 * 4],CONCAT11(g[lVar2 * 4],r[lVar2 * 4])));
      cp[1] = CONCAT13(a[lVar2 * 4 + 1],
                       CONCAT12(b[lVar2 * 4 + 1],CONCAT11(g[lVar2 * 4 + 1],r[lVar2 * 4 + 1])));
      cp[2] = CONCAT13(a[lVar2 * 4 + 2],
                       CONCAT12(b[lVar2 * 4 + 2],CONCAT11(g[lVar2 * 4 + 2],r[lVar2 * 4 + 2])));
      cp[3] = CONCAT13(a[lVar2 * 4 + 3],
                       CONCAT12(b[lVar2 * 4 + 3],CONCAT11(g[lVar2 * 4 + 3],r[lVar2 * 4 + 3])));
      cp[4] = CONCAT13(a[lVar2 * 4 + 4],
                       CONCAT12(b[lVar2 * 4 + 4],CONCAT11(g[lVar2 * 4 + 4],r[lVar2 * 4 + 4])));
      cp[5] = CONCAT13(a[lVar2 * 4 + 5],
                       CONCAT12(b[lVar2 * 4 + 5],CONCAT11(g[lVar2 * 4 + 5],r[lVar2 * 4 + 5])));
      cp[6] = CONCAT13(a[lVar2 * 4 + 6],
                       CONCAT12(b[lVar2 * 4 + 6],CONCAT11(g[lVar2 * 4 + 6],r[lVar2 * 4 + 6])));
      cp[7] = CONCAT13(a[lVar2 * 4 + 7],
                       CONCAT12(b[lVar2 * 4 + 7],CONCAT11(g[lVar2 * 4 + 7],r[lVar2 * 4 + 7])));
      cp = cp + 8;
      w = w - 8;
      lVar2 = lVar2 + 2;
      lVar1 = lVar1 + -8;
    } while (7 < w);
    b = b + -lVar1;
    g = g + -lVar1;
    r = r + -lVar1;
  }
  (*(code *)(&DAT_0032f9b4 + *(int *)(&DAT_0032f9b4 + (ulong)w * 4)))(r,cp,g,b);
  return;
}

Assistant:

DECLARESepPutFunc(putRGBAAseparate8bittile)
{
    (void)img;
    (void)x;
    (void)y;
    for (; h > 0; --h)
    {
        UNROLL8(w, NOP, *cp++ = PACK4(*r++, *g++, *b++, *a++));
        SKEW4(r, g, b, a, fromskew);
        cp += toskew;
    }
}